

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O1

Type * __thiscall
psy::C::TypeCanonicalizer::canonicalize(TypeCanonicalizer *this,Type *ty,Scope *scope)

{
  bool bVar1;
  TypeKind TVar2;
  BasicTypeKind basicTyK;
  DeclarationCategory DVar3;
  TypeDeclarationCategory TVar4;
  TagTypeKind TVar5;
  TagTypeKind TVar6;
  int iVar7;
  ArrayType *this_00;
  TypedefDeclarationSymbol *pTVar8;
  FunctionType *this_01;
  PointerType *this_02;
  QualifiedType *this_03;
  Type *pTVar9;
  undefined4 extraout_var;
  TagDeclarationSymbol *pTVar10;
  SyntaxToken *pSVar11;
  Compilation *pCVar12;
  SyntaxToken *pSVar13;
  TypeDeclarationSymbol *pTVar14;
  undefined4 extraout_var_01;
  Identifier *pIVar15;
  DeclarationSymbol *pDVar16;
  undefined4 extraout_var_02;
  ostream *poVar17;
  undefined4 extraout_var_03;
  Type *pTVar18;
  TagType *this_04;
  long lVar19;
  __hashtable *__h;
  size_type idx;
  Type *elemTy;
  __node_gen_type __node_gen;
  Type *parmTy;
  Type *retTy;
  SyntaxToken *local_148;
  Type *local_140;
  vector<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_> local_138;
  Type *local_120;
  Type *local_118;
  SyntaxToken local_110;
  SyntaxToken local_d8;
  SyntaxToken local_a0;
  SyntaxToken local_68;
  undefined4 extraout_var_00;
  
  local_148 = (SyntaxToken *)ty;
  TVar2 = Type::kind(ty);
  switch(TVar2) {
  case Array:
    this_00 = (ArrayType *)
              (*(code *)(local_148->tree_->comments_).
                        super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>
                        ._M_impl.super__Vector_impl_data._M_finish)();
    local_140 = ArrayType::elementType(this_00);
    pTVar9 = canonicalize(this,local_140,scope);
    if (pTVar9 == local_140) {
      return (Type *)local_148;
    }
    ArrayType::resetElementType(this_00,pTVar9);
    break;
  case Basic:
    pSVar11 = (SyntaxToken *)
              (*(code *)local_148->tree_[1].impl_._M_t.
                        super___uniq_ptr_impl<psy::C::SyntaxTree::SyntaxTreeImpl,_std::default_delete<psy::C::SyntaxTree::SyntaxTreeImpl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_psy::C::SyntaxTree::SyntaxTreeImpl_*,_std::default_delete<psy::C::SyntaxTree::SyntaxTreeImpl>_>
                        .super__Head_base<0UL,_psy::C::SyntaxTree::SyntaxTreeImpl_*,_false>)();
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    basicTyK = BasicType::kind((BasicType *)pSVar11);
    pSVar13 = (SyntaxToken *)Compilation::canonicalBasicType(pCVar12,basicTyK);
    goto LAB_002e9c93;
  case Function:
    this_01 = (FunctionType *)
              (*(code *)local_148->tree_[1].comments_.
                        super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>
                        ._M_impl.super__Vector_impl_data._M_start)();
    local_118 = FunctionType::returnType(this_01);
    pTVar9 = canonicalize(this,local_118,scope);
    if (pTVar9 != local_118) {
      FunctionType::setReturnType(this_01,pTVar9);
      local_138.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
      std::
      _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_138.
                    super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,&local_118);
    }
    FunctionType::parameterTypes(&local_138,this_01);
    if ((long)local_138.
              super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_138.
              super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar19 = (long)local_138.
                     super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_138.
                     super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      idx = 0;
      do {
        local_120 = (Type *)(&((_Hashtable *)
                              local_138.
                              super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_buckets)[idx];
        pTVar9 = canonicalize(this,local_120,scope);
        if (pTVar9 != local_120) {
          FunctionType::setParameterType(this_01,idx,pTVar9);
          local_140 = (Type *)&this->discardedTys_;
          std::
          _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                    ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&this->discardedTys_,&local_120,&local_140);
        }
        idx = idx + 1;
      } while (lVar19 + (ulong)(lVar19 == 0) != idx);
    }
    if ((unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
         *)local_138.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
           ._M_impl.super__Vector_impl_data._M_start ==
        (unordered_set<const_psy::C::Type_*,_std::hash<const_psy::C::Type_*>,_std::equal_to<const_psy::C::Type_*>,_std::allocator<const_psy::C::Type_*>_>
         *)0x0) {
      return (Type *)local_148;
    }
    operator_delete(local_138.
                    super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_138.
                          super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.
                          super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return (Type *)local_148;
  case Pointer:
    this_02 = (PointerType *)
              (*(code *)local_148->tree_[1].comments_.
                        super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)();
    local_140 = PointerType::referencedType(this_02);
    pTVar9 = canonicalize(this,local_140,scope);
    if (pTVar9 == local_140) {
      return (Type *)local_148;
    }
    PointerType::resetReferencedType(this_02,pTVar9);
    break;
  case TypedefName:
    pTVar9 = (Type *)(**(code **)&local_148->tree_[2].dialect_)();
    pTVar8 = TypedefNameType::declaration((TypedefNameType *)pTVar9);
    if (pTVar8 != (TypedefDeclarationSymbol *)0x0) {
      pTVar8 = TypedefNameType::declaration((TypedefNameType *)pTVar9);
      pTVar9 = &TypedefDeclarationSymbol::introducedSynonymType(pTVar8)->super_Type;
      return pTVar9;
    }
    pIVar15 = TypedefNameType::typedefName((TypedefNameType *)pTVar9);
    pDVar16 = Scope::searchForDeclaration(scope,pIVar15,OrdinaryIdentifiers);
    if (pDVar16 == (DeclarationSymbol *)0x0) {
      pSVar11 = &local_a0;
      SyntaxNode::lastToken(pSVar11,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,pSVar11);
    }
    else {
      DVar3 = DeclarationSymbol::category(pDVar16);
      if (DVar3 == Type) {
        iVar7 = (*(pDVar16->super_Symbol)._vptr_Symbol[0x17])(pDVar16);
        pTVar14 = (TypeDeclarationSymbol *)CONCAT44(extraout_var_00,iVar7);
        TVar4 = TypeDeclarationSymbol::category(pTVar14);
        if (TVar4 == Typedef) {
          iVar7 = (*(pTVar14->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x23])(pTVar14);
          pTVar18 = &TypedefDeclarationSymbol::introducedSynonymType
                               ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_01,iVar7))->
                     super_Type;
          if (pTVar18 != pTVar9) {
            local_138.
            super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
            local_140 = pTVar9;
            std::
            _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<psy::C::Type_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                      ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_138.
                          super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
            pSVar11 = (SyntaxToken *)
                      TypedefDeclarationSymbol::introducedSynonymType
                                ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_01,iVar7));
            return (Type *)pSVar11;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[ASSERT] at ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          iVar7 = 0xf4;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[ASSERT] at ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          iVar7 = 0xf2;
        }
LAB_002ea048:
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<empty message>",0xf);
        std::endl<char,std::char_traits<char>>(poVar17);
        return (Type *)local_148;
      }
      pSVar11 = &local_68;
      SyntaxNode::lastToken(pSVar11,&this->tySpecNode_->super_SyntaxNode);
      DiagnosticsReporter::ExpectedTypedefDeclaration(&this->diagReporter_,pSVar11);
    }
    goto LAB_002e9ec1;
  case Tag:
    pTVar9 = (Type *)(*(code *)local_148->tree_[2].comments_.
                               super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>
                               ._M_impl.super__Vector_impl_data._M_finish)();
    pTVar10 = TagType::declaration((TagType *)pTVar9);
    if (pTVar10 != (TagDeclarationSymbol *)0x0) {
      pTVar10 = TagType::declaration((TagType *)pTVar9);
      pTVar9 = &TagDeclarationSymbol::introducedNewType(pTVar10)->super_Type;
      return pTVar9;
    }
    pIVar15 = TagType::tag((TagType *)pTVar9);
    pDVar16 = Scope::searchForDeclaration(scope,pIVar15,Tags);
    if (pDVar16 != (DeclarationSymbol *)0x0) {
      DVar3 = DeclarationSymbol::category(pDVar16);
      if (DVar3 != Type) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                   ,0x60);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        iVar7 = 0x10d;
        goto LAB_002ea048;
      }
      iVar7 = (*(pDVar16->super_Symbol)._vptr_Symbol[0x17])(pDVar16);
      pTVar14 = (TypeDeclarationSymbol *)CONCAT44(extraout_var_02,iVar7);
      TVar4 = TypeDeclarationSymbol::category(pTVar14);
      if (TVar4 == Tag) {
        iVar7 = (*(pTVar14->super_DeclarationSymbol).super_Symbol._vptr_Symbol[0x19])(pTVar14);
        pTVar10 = (TagDeclarationSymbol *)CONCAT44(extraout_var_03,iVar7);
        pTVar18 = &TagDeclarationSymbol::introducedNewType(pTVar10)->super_Type;
        if (pTVar18 == pTVar9) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"[ASSERT] at ",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                     ,0x60);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          iVar7 = 0x111;
          goto LAB_002e9df5;
        }
        TVar5 = TagType::kind((TagType *)pTVar9);
        this_04 = TagDeclarationSymbol::introducedNewType(pTVar10);
        TVar6 = TagType::kind(this_04);
        if (TVar5 == TVar6) {
          local_138.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
          local_140 = pTVar9;
          std::
          _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<psy::C::Type_const*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
                    ();
          pTVar9 = &TagDeclarationSymbol::introducedNewType(pTVar10)->super_Type;
          pSVar11 = (SyntaxToken *)canonicalize(this,pTVar9,scope);
          bVar1 = false;
        }
        else {
          pSVar11 = &local_d8;
          SyntaxNode::lastToken(pSVar11,&this->tySpecNode_->super_SyntaxNode);
          DiagnosticsReporter::TagTypeDoesNotMatchTagDeclaration(&this->diagReporter_,pSVar11);
          SyntaxToken::~SyntaxToken(&local_d8);
          bVar1 = true;
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                   ,0x60);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        iVar7 = 0x10f;
LAB_002e9df5:
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"<empty message>",0xf);
        std::endl<char,std::char_traits<char>>(poVar17);
        bVar1 = false;
        pSVar11 = local_148;
      }
      if (!bVar1) {
        return (Type *)pSVar11;
      }
      goto LAB_002e9ec6;
    }
    SyntaxNode::lastToken(&local_110,&this->tySpecNode_->super_SyntaxNode);
    DiagnosticsReporter::TypeDeclarationNotFound(&this->diagReporter_,&local_110);
    pSVar11 = &local_110;
LAB_002e9ec1:
    SyntaxToken::~SyntaxToken(pSVar11);
LAB_002e9ec6:
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    pSVar11 = (SyntaxToken *)Compilation::canonicalErrorType(pCVar12);
    return (Type *)pSVar11;
  case Void:
    pSVar11 = (SyntaxToken *)
              (*(code *)local_148->tree_[3].impl_._M_t.
                        super___uniq_ptr_impl<psy::C::SyntaxTree::SyntaxTreeImpl,_std::default_delete<psy::C::SyntaxTree::SyntaxTreeImpl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_psy::C::SyntaxTree::SyntaxTreeImpl_*,_std::default_delete<psy::C::SyntaxTree::SyntaxTreeImpl>_>
                        .super__Head_base<0UL,_psy::C::SyntaxTree::SyntaxTreeImpl_*,_false>)();
    pCVar12 = SemanticModel::compilation(this->semaModel_);
    pSVar13 = (SyntaxToken *)Compilation::canonicalVoidType(pCVar12);
LAB_002e9c93:
    if (pSVar13 == pSVar11) {
      return (Type *)local_148;
    }
    local_138.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
    std::
    _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
              ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                *)local_138.
                  super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,&local_148);
    return (Type *)pSVar13;
  case Qualified:
    this_03 = (QualifiedType *)
              (*(code *)local_148->tree_[3].comments_.
                        super__Vector_base<psy::C::SyntaxToken,_std::allocator<psy::C::SyntaxToken>_>
                        ._M_impl.super__Vector_impl_data._M_start)();
    local_140 = QualifiedType::unqualifiedType(this_03);
    pTVar9 = canonicalize(this,local_140,scope);
    if (pTVar9 == local_140) {
      return (Type *)local_148;
    }
    TVar2 = Type::kind(pTVar9);
    if (TVar2 == Qualified) {
      iVar7 = (*pTVar9->_vptr_Type[0x11])(pTVar9);
      pTVar9 = QualifiedType::unqualifiedType((QualifiedType *)CONCAT44(extraout_var,iVar7));
    }
    QualifiedType::resetUnqualifiedType(this_03,pTVar9);
    break;
  default:
    goto switchD_002e99ce_default;
  }
  local_138.super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&this->discardedTys_;
  std::
  _Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<psy::C::Type_const*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<psy::C::Type_const*,false>>>>
            ((_Hashtable<psy::C::Type_const*,psy::C::Type_const*,std::allocator<psy::C::Type_const*>,std::__detail::_Identity,std::equal_to<psy::C::Type_const*>,std::hash<psy::C::Type_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_138.
                super__Vector_base<const_psy::C::Type_*,_std::allocator<const_psy::C::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start,&local_140);
switchD_002e99ce_default:
  return (Type *)local_148;
}

Assistant:

const Type* TypeCanonicalizer::canonicalize(const Type* ty, const Scope* scope)
{
    switch (ty->kind()) {
        case TypeKind::Array: {
            auto arrTy = ty->asArrayType();
            auto elemTy = arrTy->elementType();
            auto canonTy = canonicalize(elemTy, scope);
            if (canonTy != elemTy) {
                arrTy->resetElementType(canonTy);
                discardedTys_.insert(elemTy);
            }
            break;
        }

        case TypeKind::Basic: {
            auto basicTy = ty->asBasicType();
            auto canonTy =
                semaModel_->compilation()->canonicalBasicType(basicTy->kind());
            if (canonTy != basicTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Void: {
            auto voidTy = ty->asVoidType();
            auto canonTy = semaModel_->compilation()->canonicalVoidType();
            if (canonTy != voidTy) {
                discardedTys_.insert(ty);
                return canonTy;
            }
            break;
        }

        case TypeKind::Function: {
            auto funcTy = ty->asFunctionType();
            auto retTy = funcTy->returnType();
            auto canonTy = canonicalize(retTy, scope);
            if (canonTy != retTy) {
                funcTy->setReturnType(canonTy);
                discardedTys_.insert(retTy);
            }
            const auto parms = funcTy->parameterTypes();
            const auto parmsSize = parms.size();
            for (FunctionType::ParameterTypes::size_type idx = 0; idx < parmsSize; ++idx) {
                const Type* parmTy = parms[idx];
                canonTy = canonicalize(parmTy, scope);
                if (canonTy != parmTy) {
                    funcTy->setParameterType(idx, canonTy);
                    discardedTys_.insert(parmTy);
                }
            }
            break;
        }

        case TypeKind::Pointer: {
            auto ptrTy = ty->asPointerType();
            auto refedTy = ptrTy->referencedType();
            auto canonTy = canonicalize(refedTy, scope);
            if (canonTy != refedTy) {
                ptrTy->resetReferencedType(canonTy);
                discardedTys_.insert(refedTy);
            }
            break;
        }

        case TypeKind::TypedefName: {
            auto tydefNameTy = ty->asTypedefNameType();
            if (tydefNameTy->declaration())
                return tydefNameTy->declaration()->introducedSynonymType();
            auto tydefName = tydefNameTy->typedefName();
            auto decl = scope->searchForDeclaration(
                        tydefName,
                        NameSpace::OrdinaryIdentifiers);
            if (decl) {
                if (decl->category() == DeclarationCategory::Type) {
                    auto tyDecl = decl->asTypeDeclaration();
                    // A type declaration found under the ordinary identifiers
                    // namespace must be that of a typedef.
                    PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Typedef, return ty);
                    auto tydef = tyDecl->asTypedefDeclaration();
                    PSY_ASSERT_2(tydef->introducedSynonymType() != tydefNameTy, return ty);
                    discardedTys_.insert(tydefNameTy);
                    return tydef->introducedSynonymType();
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.ExpectedTypedefDeclaration(tySpecNode_->lastToken());
            }
            else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Tag: {
            auto tagTy = ty->asTagType();
            if (tagTy->declaration())
                return tagTy->declaration()->introducedNewType();
            auto tag = tagTy->tag();
            auto decl = scope->searchForDeclaration(
                        tag,
                        NameSpace::Tags);
            if (decl) {
                // A declaration found under the tags name space must be that
                // of a tag type declaration.
                PSY_ASSERT_2(decl->category() == DeclarationCategory::Type, return ty);
                auto tyDecl = decl->asTypeDeclaration();
                PSY_ASSERT_2(tyDecl->category() == TypeDeclarationCategory::Tag, return ty);
                auto tagDecl = tyDecl->asTagTypeDeclaration();
                PSY_ASSERT_2(tagDecl->introducedNewType() != tagTy, return ty);
                if (tagTy->kind() == tagDecl->introducedNewType()->kind()) {
                    discardedTys_.insert(tagTy);
                    return canonicalize(tagDecl->introducedNewType(), scope);
                }
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TagTypeDoesNotMatchTagDeclaration(tySpecNode_->lastToken());
            } else {
                //if (tree_->completeness() == TextCompleteness::Full)
                diagReporter_.TypeDeclarationNotFound(tySpecNode_->lastToken());
            }
            return semaModel_->compilation()->canonicalErrorType();
        }

        case TypeKind::Qualified: {
            auto qualTy = ty->asQualifiedType();
            auto unqualTy = qualTy->unqualifiedType();
            auto canonTy = canonicalize(unqualTy, scope);
            if (canonTy != unqualTy) {
                qualTy->resetUnqualifiedType(
                        canonTy->kind() == TypeKind::Qualified
                            ? canonTy->asQualifiedType()->unqualifiedType()
                            : canonTy);
                discardedTys_.insert(unqualTy);
            }
            break;
        }

        case TypeKind::Error:
            break;
    }

    return ty;
}